

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult.cpp
# Opt level: O1

void __thiscall QSqlResult::QSqlResult(QSqlResult *this,QSqlResultPrivate *dd)

{
  Data *pDVar1;
  NumericalPrecisionPolicy NVar2;
  undefined8 extraout_RDX;
  
  this->_vptr_QSqlResult = (_func_int **)&PTR__QSqlResult_0014f4e0;
  this->d_ptr = dd;
  pDVar1 = (dd->sqldriver).wp.d;
  if (((pDVar1 != (Data *)0x0) && ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0))
     && ((dd->sqldriver).wp.value != (QObject *)0x0)) {
    NVar2 = QSqlDriver::numericalPrecisionPolicy((QSqlDriver *)(dd->sqldriver).wp.value);
    (*this->_vptr_QSqlResult[0x1d])(this,(ulong)NVar2,extraout_RDX,this->_vptr_QSqlResult[0x1d]);
    return;
  }
  return;
}

Assistant:

QSqlResult::QSqlResult(QSqlResultPrivate &dd)
    : d_ptr(&dd)
{
    Q_D(QSqlResult);
    if (d->sqldriver)
        setNumericalPrecisionPolicy(d->sqldriver->numericalPrecisionPolicy());
}